

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O0

uint32_t Crap8(uint8_t *key,uint32_t len,uint32_t seed)

{
  long lVar1;
  uint64_t p;
  uint32_t k;
  uint32_t h;
  uint32_t *key4;
  uint32_t n;
  uint32_t m;
  uint32_t seed_local;
  uint32_t len_local;
  uint8_t *key_local;
  
  h = len + seed;
  k = len + 0x97e1cc59;
  key4 = (uint32_t *)key;
  for (len_local = len; 7 < len_local; len_local = len_local - 8) {
    k = (uint)((ulong)key4[1] * 0x83d2e73b) ^ (uint)((ulong)*key4 * 0x83d2e73b) ^ k;
    h = (uint)((ulong)key4[1] * 0x83d2e73b >> 0x20) ^
        ((uint)((ulong)*key4 * 0x83d2e73b >> 0x20) ^ h * -0x7c2d18c5) * -0x7c2d18c5;
    key4 = key4 + 2;
  }
  if (3 < len_local) {
    k = (uint)((ulong)*key4 * 0x83d2e73b) ^ k;
    h = (uint)((ulong)*key4 * 0x83d2e73b >> 0x20) ^ h * -0x7c2d18c5;
    key4 = key4 + 1;
    len_local = len_local - 4;
  }
  if (len_local != 0) {
    lVar1 = (ulong)(*key4 & (1 << ((byte)(len_local << 3) & 0x1f)) - 1U) * 0x83d2e73b;
    k = (uint)lVar1 ^ k;
    h = (uint)((ulong)lVar1 >> 0x20) ^ h * -0x7c2d18c5;
  }
  lVar1 = (ulong)(h ^ k) * 0x97e1cc59;
  return (uint)((ulong)lVar1 >> 0x20) ^ (uint)lVar1 ^ k;
}

Assistant:

uint32_t
Crap8(const uint8_t * key, uint32_t len, uint32_t seed)
{
#define c8fold( a, b, y, z ) { p = (uint32_t)(a) * (uint64_t)(b); y ^= (uint32_t)p; z ^= (uint32_t)(p >> 32); }
#define c8mix( in ) { h *= m; c8fold( in, m, k, h ); }

  const uint32_t  m = 0x83d2e73b, n = 0x97e1cc59, *key4 = (const uint32_t *)key;
  uint32_t	  h = len + seed, k = n + len;
  uint64_t	  p;

  while (len >= 8) {
    c8mix(key4[0]) c8mix(key4[1]) key4 += 2;
    len -= 8;
  }
  if (len >= 4) {
    c8mix(key4[0]) key4 += 1;
    len -= 4;
  }
  if (len) {
    c8mix(key4[0] & ((1 << (len * 8)) - 1))
  }
  c8fold(h ^ k, n, k, k)
  return k;
}